

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O2

int secp256k1_is_zero_array(uchar *s,size_t len)

{
  size_t sVar1;
  bool bVar2;
  uchar acc;
  byte local_9;
  
  local_9 = 0;
  for (sVar1 = 0; len != sVar1; sVar1 = sVar1 + 1) {
    local_9 = local_9 | s[sVar1];
  }
  bVar2 = local_9 == 0;
  secp256k1_memclear(&local_9,1);
  return (int)bVar2;
}

Assistant:

static SECP256K1_INLINE int secp256k1_is_zero_array(const unsigned char *s, size_t len) {
    unsigned char acc = 0;
    int ret;
    size_t i;

    for (i = 0; i < len; i++) {
        acc |= s[i];
    }
    ret = (acc == 0);
    /* acc may contain secret values. Try to explicitly clear it. */
    secp256k1_memclear(&acc, sizeof(acc));
    return ret;
}